

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_printer.cpp
# Opt level: O1

void printGraphVizToFile(Graph *G,string *filename)

{
  type *ptVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  ostream *poVar5;
  AdjList *g;
  type extraout_RDX;
  type extraout_RDX_00;
  type tVar6;
  long lVar7;
  type tVar8;
  type *ptVar9;
  long lVar10;
  EdgeIterator e;
  EdgeIterator e_end;
  ofstream gout;
  undefined8 local_368;
  undefined1 uStack_360;
  undefined7 uStack_35f;
  undefined1 uStack_358;
  undefined7 uStack_357;
  char cStack_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  Graph *local_320;
  undefined8 local_318;
  undefined1 uStack_310;
  undefined7 uStack_30f;
  undefined1 uStack_308;
  undefined8 uStack_307;
  long local_2f8;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_2d0;
  undefined1 *local_240;
  undefined8 *local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)filename);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"digraph G",9);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"{",1);
  cVar4 = std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  tVar8._0_4_ = (uint)cVar4;
  tVar8._4_4_ = 0;
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  lVar7 = (long)(G->super_type).m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(G->super_type).m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
  tVar6 = extraout_RDX;
  local_320 = G;
  if (lVar7 != 0) {
    lVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"   ",3);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
      cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      tVar8._0_4_ = (uint)cVar4;
      tVar8._4_4_ = 0;
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      lVar10 = lVar10 + 1;
      tVar6 = extraout_RDX_00;
    } while (lVar7 >> 5 != lVar10);
  }
  uStack_358 = 0;
  uStack_357 = 0;
  cStack_350 = '\0';
  local_368 = 0;
  uStack_360 = 0;
  uStack_35f = 0;
  uStack_308 = 0;
  uStack_307 = 0;
  local_318 = 0;
  uStack_310 = 0;
  uStack_30f = 0;
  ptVar9 = (type *)(local_320->super_type).m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (type *)(local_320->super_type).m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  local_2d0.first.vEnd.m_value = (long)ptVar1 - (long)ptVar9 >> 5;
  if (ptVar1 == ptVar9) {
    local_2d0.first.vCurr.m_value = 0;
    local_2d0.first.edges.super_type.m_initialized = false;
  }
  else {
    tVar6 = *ptVar9;
    tVar8 = ptVar9[1];
    if (tVar8 == tVar6) {
      ptVar9 = ptVar9 + 5;
      local_2d0.first.vCurr.m_value = 0;
      do {
        if (local_2d0.first.vEnd.m_value - 1 == local_2d0.first.vCurr.m_value) {
          local_2d0.first.edges.super_type.m_initialized = false;
          local_2d0.first.vCurr.m_value = local_2d0.first.vEnd.m_value;
          goto LAB_00111664;
        }
        tVar6 = (type)((_Vector_impl_data *)(ptVar9 + -1))->_M_start;
        tVar8 = *ptVar9;
        ptVar9 = ptVar9 + 4;
        local_2d0.first.vCurr.m_value = local_2d0.first.vCurr.m_value + 1;
      } while (tVar8 == tVar6);
    }
    else {
      local_2d0.first.vCurr.m_value = 0;
    }
    local_2d0.first.edges.super_type.m_initialized = true;
  }
LAB_00111664:
  local_2d0.first.vBegin.m_value = 0;
  if (local_2d0.first.edges.super_type.m_initialized) {
    local_2d0.first.edges.super_type.m_storage.dummy_.aligner_ = tVar6;
    local_2d0.first.edges.super_type.m_storage.dummy_._8_8_ = local_2d0.first.vCurr.m_value;
    local_2d0.first.edges.super_type.m_storage.dummy_._16_8_ = tVar8;
    local_2d0.first.edges.super_type.m_storage.dummy_._24_8_ = local_2d0.first.vCurr.m_value;
  }
  local_2d0.first.m_g = local_320;
  local_2d0.second.vBegin.m_value = 0;
  local_2d0.second.edges.super_type.m_initialized = false;
  local_2d0.second.m_g = local_320;
  local_238 = &local_318;
  local_2d0.second.vCurr.m_value = local_2d0.first.vEnd.m_value;
  local_2d0.second.vEnd.m_value = local_2d0.first.vEnd.m_value;
  local_240 = (undefined1 *)&local_368;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_240,&local_2d0);
  if (local_2d0.second.edges.super_type.m_initialized == true) {
    local_2d0.second.edges.super_type.m_initialized = false;
  }
  if (local_2d0.first.edges.super_type.m_initialized == true) {
    local_2d0.first.edges.super_type.m_initialized = false;
  }
LAB_00111740:
  do {
    if (CONCAT71(uStack_35f,uStack_360) == CONCAT71(uStack_30f,uStack_310)) {
      if (CONCAT71(uStack_35f,uStack_360) == CONCAT71(uStack_357,uStack_358)) {
LAB_001118c4:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"}",1);
        std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
        std::ostream::put((char)&local_230);
        std::ostream::flush();
        if (uStack_307._7_1_ == '\x01') {
          uStack_307 = uStack_307 & 0xffffffffffffff;
        }
        if (cStack_350 == '\x01') {
          cStack_350 = '\0';
        }
        local_230 = _VTT;
        *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _error_with_option_name;
        std::filebuf::~filebuf(local_228);
        std::ios_base::~ios_base(local_138);
        return;
      }
      if ((cStack_350 == '\0') || (uStack_307._7_1_ == '\0')) goto LAB_00111973;
      if (local_348 == local_2f8) goto LAB_001118c4;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"   ",3);
    if (cStack_350 == '\0') {
LAB_00111973:
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                    "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," -> ",4);
    if (cStack_350 == '\0') goto LAB_00111973;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," [label=",8);
    if (cStack_350 == '\0') goto LAB_00111973;
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,**(int **)(local_348 + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"];",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (cStack_350 == '\0') {
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                    "pointer_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    local_348 = local_348 + 0x10;
    if (local_348 == local_338) {
      lVar7 = CONCAT71(uStack_35f,uStack_360);
      lVar10 = lVar7 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_357,uStack_358) + -1 == lVar7) {
          uStack_360 = uStack_358;
          uStack_35f = uStack_357;
          goto LAB_00111740;
        }
        lVar2 = *(long *)(*(long *)(local_328 + 0x18) + -8 + lVar10);
        lVar3 = *(long *)(*(long *)(local_328 + 0x18) + lVar10);
        lVar10 = lVar10 + 0x20;
        lVar7 = lVar7 + 1;
      } while (lVar3 == lVar2);
      uStack_360 = (undefined1)lVar7;
      uStack_35f = (undefined7)((ulong)lVar7 >> 8);
      local_348 = lVar2;
      local_340 = lVar7;
      local_338 = lVar3;
      local_330 = lVar7;
    }
  } while( true );
}

Assistant:

void printGraphVizToFile(Graph G, std::string filename)
{
    std::ofstream gout;
    gout.open(filename);

    gout << "digraph G" << std::endl;
    gout << "{" << std::endl;

    VertexIterator v, v_end;
    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
        gout << "   " << *v << ";" << std::endl;
    }

    EdgeIterator e, e_end;
    for(boost::tie(e, e_end) = boost::edges(G); e != e_end; ++e) {
        gout << "   " << source(*e, G) << " -> " << target(*e, G);
        gout << " [label=" << G[*e].weight << "];" << std::endl;
    }

    gout << "}" << std::endl;
}